

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClassList *stm)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  unique_ptr *this_00;
  reference pvVar4;
  pointer pCVar5;
  pointer pCVar6;
  CError local_78;
  TypeInfo local_48;
  int local_20;
  byte local_19;
  int index;
  bool areAllClassBuilt;
  CClassList *stm_local;
  CTypeCheckerVisitor *this_local;
  
  _index = stm;
  stm_local = (CClassList *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: classlist\n");
  local_19 = 1;
  local_20 = 0;
  do {
    uVar2 = (ulong)local_20;
    sVar3 = std::
            vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
            ::size(&_index->classes);
    if (sVar3 <= uVar2) {
LAB_001443f1:
      if ((local_19 & 1) == 0) {
        CError::CError(&local_78,(string *)CError::AST_ERROR_abi_cxx11_,
                       &(_index->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_78);
        CError::~CError(&local_78);
      }
      else {
        TypeInfo::TypeInfo(&local_48,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_48);
        TypeInfo::~TypeInfo(&local_48);
      }
      return;
    }
    this_00 = (unique_ptr *)
              std::
              vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
              ::operator[](&_index->classes,(long)local_20);
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (!bVar1) {
      local_19 = 0;
      goto LAB_001443f1;
    }
    std::operator<<((ostream *)&std::cout,"Accepting of class: \n");
    pvVar4 = std::
             vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
             ::operator[](&_index->classes,(long)local_20);
    pCVar5 = std::unique_ptr<CClass,_std::default_delete<CClass>_>::operator->(pvVar4);
    pCVar6 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&pCVar5->id);
    std::operator<<((ostream *)&std::cout,(string *)&pCVar6->name);
    std::operator<<((ostream *)&std::cout,"\nLet\'s begin\n");
    pvVar4 = std::
             vector<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
             ::operator[](&_index->classes,(long)local_20);
    pCVar5 = std::unique_ptr<CClass,_std::default_delete<CClass>_>::operator->(pvVar4);
    (**(pCVar5->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CClassList &stm ) 
{
	std::cout << "typechecker: classlist\n";
    bool areAllClassBuilt = true;
    for (int index = 0; index < stm.classes.size(); ++index) {;
        if( !stm.classes[index]) {
            areAllClassBuilt = false;
            break;
        }
        std::cout << "Accepting of class: \n";
        std::cout << stm.classes[index]->id->name;
        std::cout << "\nLet's begin\n";
        stm.classes[index]->Accept( *this );
    }
    if( areAllClassBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}